

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::torrent::set_metadata(torrent *this,span<const_char> metadata_buf)

{
  int *piVar1;
  _Atomic_word *p_Var2;
  info_hash_t *this_00;
  byte bVar3;
  uint uVar4;
  element_type *peVar5;
  session_interface *psVar6;
  pointer pppVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  void *pvVar13;
  bool bVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  protocol_version extraout_DL;
  protocol_version extraout_DL_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  EVP_PKEY_CTX *ctx;
  sha256_hash *this_02;
  pointer pppVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  span<const_char> buffer;
  bool failed;
  int pos;
  shared_ptr<libtorrent::torrent_info> info;
  info_hash_t old_ih;
  bdecode_node metadata;
  int in_stack_fffffffffffffee0;
  char local_119;
  undefined1 local_118 [32];
  undefined1 local_f8 [40];
  error_code local_d0;
  undefined1 local_bc [4];
  undefined1 local_b8 [16];
  undefined1 local_a8 [56];
  bdecode_node local_70;
  
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)metadata_buf.m_ptr;
  peVar5 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (0 < (peVar5->m_files).m_piece_length) {
    return false;
  }
  bVar14 = digest32<160L>::is_all_zeros(&(peVar5->m_info_hash).v1);
  if (!bVar14) {
    lcrypto::hasher::hasher((hasher *)&local_70,metadata_buf);
    lcrypto::hasher::final((sha1_hash *)local_a8,(hasher *)&local_70);
    lcrypto::hasher::~hasher((hasher *)&local_70);
    peVar5 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = (peVar5->m_info_hash).v1.m_number._M_elems[4];
    auVar18[0] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[0] == local_a8[0]);
    auVar18[1] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 1) == local_a8[1]);
    auVar18[2] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 2) == local_a8[2]);
    auVar18[3] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 3) == local_a8[3]);
    auVar18[4] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[1] == local_a8[4]);
    auVar18[5] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 5) == local_a8[5]);
    auVar18[6] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 6) == local_a8[6]);
    auVar18[7] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 7) == local_a8[7]);
    auVar18[8] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[2] == local_a8[8]);
    auVar18[9] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 9) == local_a8[9]);
    auVar18[10] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 10) == local_a8[10]
                   );
    auVar18[0xb] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xb) ==
                    local_a8[0xb]);
    auVar18[0xc] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[3] == local_a8[0xc]);
    auVar18[0xd] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xd) ==
                    local_a8[0xd]);
    auVar18[0xe] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xe) ==
                    local_a8[0xe]);
    auVar18[0xf] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xf) ==
                    local_a8[0xf]);
    auVar21[0] = -((char)local_a8._16_4_ == (char)uVar4);
    auVar21[1] = -(SUB41(local_a8._16_4_,1) == (char)(uVar4 >> 8));
    auVar21[2] = -(SUB41(local_a8._16_4_,2) == (char)(uVar4 >> 0x10));
    auVar21[3] = -(SUB41(local_a8._16_4_,3) == (char)(uVar4 >> 0x18));
    auVar21[4] = 0xff;
    auVar21[5] = 0xff;
    auVar21[6] = 0xff;
    auVar21[7] = 0xff;
    auVar21[8] = 0xff;
    auVar21[9] = 0xff;
    auVar21[10] = 0xff;
    auVar21[0xb] = 0xff;
    auVar21[0xc] = 0xff;
    auVar21[0xd] = 0xff;
    auVar21[0xe] = 0xff;
    auVar21[0xf] = 0xff;
    auVar18 = auVar18 & auVar21;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
      lcrypto::hasher256::hasher256((hasher256 *)local_118,metadata_buf);
      lcrypto::hasher256::final((sha256_hash *)&local_70,(hasher256 *)local_118);
      lcrypto::hasher256::~hasher256((hasher256 *)local_118);
      local_118[1] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._1_1_;
      local_118[0] = (char)local_70.m_tokens.
                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           ._M_impl.super__Vector_impl_data._M_start;
      local_118[2] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._2_1_;
      local_118[3] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._3_1_;
      local_118[4] = (bool)local_70.m_tokens.
                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_1_;
      local_118[5] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._5_1_;
      local_118[6] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._6_1_;
      local_118[7] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_start._7_1_;
      local_118[8] = (char)local_70.m_tokens.
                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
      local_118[9] = local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._1_1_;
      local_118[10] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish._2_1_;
      local_118[0xb] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish._3_1_;
      local_118[0xc] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish._4_1_;
      local_118[0xd] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish._5_1_;
      local_118[0xe] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish._6_1_;
      local_118[0xf] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_finish._7_1_;
      local_118[0x11] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_;
      local_118[0x10] =
           (char)local_70.m_tokens.
                 super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118[0x12] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_;
      local_118[0x13] =
           local_70.m_tokens.
           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_;
      peVar5 = (this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = (peVar5->m_info_hash).v1.m_number._M_elems[4];
      auVar23[0] = -((char)local_70.m_tokens.
                           super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage == (char)uVar4);
      auVar23[1] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ == (char)(uVar4 >> 8))
      ;
      auVar23[2] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                    (char)(uVar4 >> 0x10));
      auVar23[3] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                    (char)(uVar4 >> 0x18));
      auVar23[4] = 0xff;
      auVar23[5] = 0xff;
      auVar23[6] = 0xff;
      auVar23[7] = 0xff;
      auVar23[8] = 0xff;
      auVar23[9] = 0xff;
      auVar23[10] = 0xff;
      auVar23[0xb] = 0xff;
      auVar23[0xc] = 0xff;
      auVar23[0xd] = 0xff;
      auVar23[0xe] = 0xff;
      auVar23[0xf] = 0xff;
      auVar20[0] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[0] ==
                    (char)local_70.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      auVar20[1] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 1) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._1_1_);
      auVar20[2] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 2) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._2_1_);
      auVar20[3] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 3) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._3_1_);
      auVar20[4] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[1] ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._4_1_);
      auVar20[5] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 5) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._5_1_);
      auVar20[6] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 6) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._6_1_);
      auVar20[7] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 7) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start._7_1_);
      auVar20[8] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[2] ==
                    (char)local_70.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      auVar20[9] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 9) ==
                    local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._1_1_);
      auVar20[10] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 10) ==
                     local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._2_1_);
      auVar20[0xb] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xb) ==
                      local_70.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._3_1_);
      auVar20[0xc] = -((char)(peVar5->m_info_hash).v1.m_number._M_elems[3] ==
                      local_70.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._4_1_);
      auVar20[0xd] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xd) ==
                      local_70.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._5_1_);
      auVar20[0xe] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xe) ==
                      local_70.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._6_1_);
      auVar20[0xf] = -(*(char *)((long)(peVar5->m_info_hash).v1.m_number._M_elems + 0xf) ==
                      local_70.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_finish._7_1_);
      auVar20 = auVar20 & auVar23;
      if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) {
        iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        if ((*(uint *)(CONCAT44(extraout_var,iVar15) + 0x68) & 1) == 0) {
          return false;
        }
        iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_118);
        local_f8._0_4_ = 0x1e;
        alert_manager::
        emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                  ((alert_manager *)CONCAT44(extraout_var_00,iVar15),(torrent_handle *)local_118,
                   (error_code_enum *)local_f8);
        if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_118._8_8_ ==
            (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
          return false;
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_118._8_8_)->
                                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ).
                                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + 4);
          iVar15 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar15 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_118._8_8_)->
                                   super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ).
                                   super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 4);
          *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_118._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar15 + -1;
        }
        if (iVar15 != 1) {
          return false;
        }
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_118._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
        return false;
      }
    }
  }
  bVar14 = digest32<256L>::is_all_zeros
                     (&(((this->super_torrent_hot_members).m_torrent_file.
                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->m_info_hash).v2);
  if (!bVar14) {
    lcrypto::hasher256::hasher256((hasher256 *)local_a8,metadata_buf);
    lcrypto::hasher256::final((sha256_hash *)&local_70,(hasher256 *)local_a8);
    lcrypto::hasher256::~hasher256((hasher256 *)local_a8);
    peVar5 = (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar18 = *(undefined1 (*) [16])((peVar5->m_info_hash).v2.m_number._M_elems + 4);
    auVar22[0] = -((char)local_70.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_start ==
                  (char)(peVar5->m_info_hash).v2.m_number._M_elems[0]);
    auVar22[1] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._1_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 1));
    auVar22[2] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._2_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 2));
    auVar22[3] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._3_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 3));
    auVar22[4] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._4_1_ ==
                  (char)(peVar5->m_info_hash).v2.m_number._M_elems[1]);
    auVar22[5] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._5_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 5));
    auVar22[6] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._6_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 6));
    auVar22[7] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_start._7_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 7));
    auVar22[8] = -((char)local_70.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_finish ==
                  (char)(peVar5->m_info_hash).v2.m_number._M_elems[2]);
    auVar22[9] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                  *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 9));
    auVar22[10] = -(local_70.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                   *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 10));
    auVar22[0xb] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                    *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 0xb));
    auVar22[0xc] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                    (char)(peVar5->m_info_hash).v2.m_number._M_elems[3]);
    auVar22[0xd] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                    *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 0xd));
    auVar22[0xe] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                    *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 0xe));
    auVar22[0xf] = -(local_70.m_tokens.
                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                     ._M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                    *(char *)((long)(peVar5->m_info_hash).v2.m_number._M_elems + 0xf));
    auVar19[0] = -((char)local_70.m_tokens.
                         super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage == auVar18[0]);
    auVar19[1] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ == auVar18[1]);
    auVar19[2] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ == auVar18[2]);
    auVar19[3] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ == auVar18[3]);
    auVar19[4] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ == auVar18[4]);
    auVar19[5] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ == auVar18[5]);
    auVar19[6] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ == auVar18[6]);
    auVar19[7] = -(local_70.m_tokens.
                   super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == auVar18[7]);
    auVar19[8] = -((char)local_70.m_root_tokens == auVar18[8]);
    auVar19[9] = -(local_70.m_root_tokens._1_1_ == auVar18[9]);
    auVar19[10] = -(local_70.m_root_tokens._2_1_ == auVar18[10]);
    auVar19[0xb] = -(local_70.m_root_tokens._3_1_ == auVar18[0xb]);
    auVar19[0xc] = -(local_70.m_root_tokens._4_1_ == auVar18[0xc]);
    auVar19[0xd] = -(local_70.m_root_tokens._5_1_ == auVar18[0xd]);
    auVar19[0xe] = -(local_70.m_root_tokens._6_1_ == auVar18[0xe]);
    auVar19[0xf] = -(local_70.m_root_tokens._7_1_ == auVar18[0xf]);
    auVar19 = auVar19 & auVar22;
    bVar14 = (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff;
    if (bVar14) {
      iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      if ((*(uint *)(CONCAT44(extraout_var_01,iVar15) + 0x68) & 1) != 0) {
        local_f8._32_8_ = this_01;
        iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_a8);
        local_118._0_4_ = 0x1e;
        alert_manager::
        emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,libtorrent::errors::error_code_enum>
                  ((alert_manager *)CONCAT44(extraout_var_02,iVar15),(torrent_handle *)local_a8,
                   (error_code_enum *)local_118);
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._32_8_;
        if ((piece_picker *)local_a8._8_8_ != (piece_picker *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            piVar1 = (int *)(local_a8._8_8_ + 0xc);
            iVar15 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
          }
          else {
            iVar15 = *(int *)(local_a8._8_8_ + 0xc);
            *(int *)(local_a8._8_8_ + 0xc) = iVar15 + -1;
          }
          if (iVar15 == 1) {
            (**(code **)(*(long *)local_a8._8_8_ + 0x18))();
          }
        }
      }
      if (bVar14) {
        return false;
      }
    }
  }
  peVar5 = (this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_a8._48_4_ = (peVar5->m_info_hash).v2.m_number._M_elems[7];
  local_a8._0_8_ = *(undefined8 *)(peVar5->m_info_hash).v1.m_number._M_elems;
  local_a8._8_8_ = *(undefined8 *)((peVar5->m_info_hash).v1.m_number._M_elems + 2);
  local_a8._16_8_ = *(undefined8 *)((peVar5->m_info_hash).v1.m_number._M_elems + 4);
  local_a8._24_8_ = *(undefined8 *)((peVar5->m_info_hash).v2.m_number._M_elems + 1);
  local_a8._32_8_ = *(undefined8 *)((peVar5->m_info_hash).v2.m_number._M_elems + 3);
  local_a8._40_8_ = *(undefined8 *)((peVar5->m_info_hash).v2.m_number._M_elems + 5);
  local_d0._0_8_ = local_d0._5_8_ << 0x28;
  local_d0.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  local_bc = (undefined1  [4])0x0;
  local_f8._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)metadata_buf.m_len;
  iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x2e])();
  local_118[8] = 0;
  local_118._0_8_ = CONCAT44(extraout_var_03,iVar15) + 0x438;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_118);
  local_118[8] = 1;
  iVar15 = *(int *)(CONCAT44(extraout_var_03,iVar15) + 0x400);
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_118);
  buffer.m_len = (difference_type)&local_d0;
  buffer.m_ptr = (char *)local_f8._32_8_;
  bdecode(&local_70,(libtorrent *)this_01,buffer,(error_code *)local_bc,(int *)0xc8,iVar15,
          in_stack_fffffffffffffee0);
  local_b8._0_8_ = (torrent_info *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::torrent_info,std::allocator<libtorrent::torrent_info>,libtorrent::torrent_info&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8),(torrent_info **)local_b8,
             (allocator<libtorrent::torrent_info> *)local_118,
             (this->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  uVar8 = local_b8._0_8_;
  if (local_d0.failed_ == false) {
    iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[0x2e])();
    local_118[8] = 0;
    local_118._0_8_ = CONCAT44(extraout_var_04,iVar15) + 0x438;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_118);
    local_118[8] = 1;
    iVar15 = *(int *)(CONCAT44(extraout_var_04,iVar15) + 0x3fc);
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_118);
    bVar14 = torrent_info::parse_info_section((torrent_info *)uVar8,&local_70,&local_d0,iVar15);
    uVar8 = local_b8._0_8_;
    if (bVar14) {
      local_119 = '\0';
      this_00 = (info_hash_t *)(local_b8._0_8_ + 0x230);
      local_118._8_8_ = this;
      local_118._0_8_ = &local_119;
      local_118._16_8_ = (hash_picker *)local_b8;
      bVar14 = digest32<160L>::is_all_zeros((digest32<160L> *)this_00);
      if (!bVar14) {
        set_metadata::anon_class_24_3_1e81adb4::operator()
                  ((anon_class_24_3_1e81adb4 *)local_118,(sha1_hash *)this_00,extraout_DL);
      }
      this_02 = &((info_hash_t *)(uVar8 + 0x230))->v2;
      bVar14 = digest32<256L>::is_all_zeros(this_02);
      if (!bVar14) {
        local_f8._16_4_ = (((info_hash_t *)(uVar8 + 0x230))->v2).m_number._M_elems[4];
        local_f8._0_8_ = *(undefined8 *)(this_02->m_number)._M_elems;
        local_f8._8_8_ =
             *(undefined8 *)((((info_hash_t *)(uVar8 + 0x230))->v2).m_number._M_elems + 2);
        set_metadata::anon_class_24_3_1e81adb4::operator()
                  ((anon_class_24_3_1e81adb4 *)local_118,(sha1_hash *)local_f8,extraout_DL_00);
      }
      bVar14 = true;
      if ((local_119 == '\0') && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) {
        (this->super_torrent_hot_members).m_torrent_file.
        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_b8._0_8_;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
        peVar5 = (this->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        psVar6 = (this->super_torrent_hot_members).m_ses;
        uVar8 = *(undefined8 *)((peVar5->m_info_hash).v1.m_number._M_elems + 2);
        uVar9 = *(undefined8 *)((peVar5->m_info_hash).v1.m_number._M_elems + 4);
        uVar10 = *(undefined8 *)((peVar5->m_info_hash).v2.m_number._M_elems + 1);
        uVar11 = *(undefined8 *)((peVar5->m_info_hash).v2.m_number._M_elems + 3);
        uVar12 = *(undefined8 *)((peVar5->m_info_hash).v2.m_number._M_elems + 5);
        *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems =
             *(undefined8 *)(peVar5->m_info_hash).v1.m_number._M_elems;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar8;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar9;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar10;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) = uVar11;
        *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar12;
        (this->m_info_hash).v2.m_number._M_elems[7] = (peVar5->m_info_hash).v2.m_number._M_elems[7];
        (this->super_torrent_hot_members).m_size_on_disk = (peVar5->m_files).m_size_on_disk;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_118,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        ctx = (EVP_PKEY_CTX *)local_118;
        (*(psVar6->super_session_logger)._vptr_session_logger[0x1a])(psVar6,ctx,local_a8);
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_118._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        local_d0 = initialize_merkle_trees(this);
        if (local_d0.failed_ == true) {
          set_error(this,&local_d0,(file_index_t)0xfffffffc);
          bVar14 = false;
          pause(this);
        }
        else {
          update_gauge(this);
          update_want_tick(this);
          iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var_07,iVar15) + 0x68) & 0x40) != 0) {
            iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[5])();
            get_handle((torrent *)local_f8);
            ctx = (EVP_PKEY_CTX *)local_f8;
            alert_manager::
            emplace_alert<libtorrent::metadata_received_alert,libtorrent::torrent_handle>
                      ((alert_manager *)CONCAT44(extraout_var_08,iVar15),(torrent_handle *)ctx);
            if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_f8._8_8_ !=
                (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                piVar1 = (int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_f8._8_8_)->
                                        super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                        ).
                                        super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 4);
                iVar15 = *piVar1;
                *piVar1 = *piVar1 + -1;
                UNLOCK();
              }
              else {
                iVar15 = *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_f8._8_8_)->
                                         super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                         ).
                                         super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                         ._M_impl.super__Vector_impl_data._M_finish + 4);
                *(int *)((long)&(((vector<piece_pos,_piece_index_t> *)local_f8._8_8_)->
                                super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ).
                                super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 4) = iVar15 + -1;
              }
              if (iVar15 == 1) {
                (*(code *)(((vector<piece_pos,_piece_index_t> *)local_f8._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_start[3])();
              }
            }
          }
          init(this,ctx);
          iVar15 = (((this->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_num_pieces;
          iVar16 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[0x4b])();
          counters::inc_stats_counter
                    ((counters *)CONCAT44(extraout_var_09,iVar16),0x6e,(long)iVar15);
          pppVar7 = (this->super_torrent_hot_members).m_connections.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pppVar17 = (this->super_torrent_hot_members).m_connections.
                          super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          .
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; pppVar17 != pppVar7;
              pppVar17 = pppVar17 + 1) {
            peer_connection::disconnect_if_redundant(*pppVar17);
          }
          bVar3 = (this->m_need_save_resume_data).m_val;
          if (-1 < (char)bVar3) {
            (this->m_need_save_resume_data).m_val = bVar3 | 0x80;
            state_updated(this);
          }
        }
      }
      goto LAB_003309f5;
    }
  }
  update_gauge(this);
  iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [5])();
  if ((*(uint *)(CONCAT44(extraout_var_05,iVar15) + 0x68) & 1) != 0) {
    iVar15 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_f8);
    alert_manager::
    emplace_alert<libtorrent::metadata_failed_alert,libtorrent::torrent_handle,boost::system::error_code&>
              ((alert_manager *)CONCAT44(extraout_var_06,iVar15),(torrent_handle *)local_f8,
               &local_d0);
    if ((piece_picker *)local_f8._8_8_ != (piece_picker *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2 = (_Atomic_word *)(local_f8._8_8_ + 0xc);
        iVar15 = *p_Var2;
        *p_Var2 = *p_Var2 + -1;
        UNLOCK();
      }
      else {
        iVar15 = *(_Atomic_word *)(local_f8._8_8_ + 0xc);
        *(int *)(local_f8._8_8_ + 0xc) = iVar15 + -1;
      }
      if (iVar15 == 1) {
        (*(code *)(((vector<piece_pos,_piece_index_t> *)local_f8._8_8_)->
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ).
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start[3])();
      }
    }
  }
  local_118._0_16_ = (undefined1  [16])errors::make_error_code(invalid_swarm_metadata);
  set_error(this,(error_code *)local_118,(file_index_t)0xffffffff);
  bVar14 = false;
  pause(this);
LAB_003309f5:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  pvVar13 = (void *)CONCAT17(local_70.m_tokens.
                             super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             ._M_impl.super__Vector_impl_data._M_start._7_1_,
                             CONCAT16(local_70.m_tokens.
                                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                      ._M_impl.super__Vector_impl_data._M_start._6_1_,
                                      CONCAT15(local_70.m_tokens.
                                               super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                               ._M_impl.super__Vector_impl_data._M_start._5_1_,
                                               CONCAT14(local_70.m_tokens.
                                                                                                                
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_1_,
                                                  CONCAT13(local_70.m_tokens.
                                                                                                                      
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._3_1_,
                                                  CONCAT12(local_70.m_tokens.
                                                                                                                      
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._2_1_,
                                                  CONCAT11(local_70.m_tokens.
                                                                                                                      
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_1_,
                                                  (char)local_70.m_tokens.
                                                                                                                
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)))))));
  if (pvVar13 != (void *)0x0) {
    operator_delete(pvVar13,CONCAT17(local_70.m_tokens.
                                     super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                     CONCAT16(local_70.m_tokens.
                                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _6_1_,CONCAT15(local_70.m_tokens.
                                                                                                                          
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(local_70.m_tokens.
                                                                                                                                    
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(local_70.m_tokens.
                                                                                                                                    
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(local_70.m_tokens.
                                                                                                                                    
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(local_70.m_tokens.
                                                                                                                                    
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(char)local_70.m_tokens.
                                                                                                                              
                                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) - (long)pvVar13);
  }
  return bVar14;
}

Assistant:

bool torrent::set_metadata(span<char const> metadata_buf)
	{
		TORRENT_ASSERT(is_single_thread());
		INVARIANT_CHECK;

		if (m_torrent_file->is_valid()) return false;

		if (m_torrent_file->info_hashes().has_v1())
		{
			sha1_hash const info_hash = hasher(metadata_buf).final();
			if (info_hash != m_torrent_file->info_hashes().v1)
			{
				// check if the v1 hash is a truncated v2 hash
				sha256_hash const info_hash2 = hasher256(metadata_buf).final();
				if (sha1_hash(info_hash2.data()) != m_torrent_file->info_hashes().v1)
				{
					if (alerts().should_post<metadata_failed_alert>())
					{
						alerts().emplace_alert<metadata_failed_alert>(get_handle()
							, errors::mismatching_info_hash);
					}
					return false;
				}
			}
		}
		if (m_torrent_file->info_hashes().has_v2())
		{
			// we don't have to worry about computing the v2 hash twice because
			// if the v1 hash was a truncated v2 hash then the torrent_file should
			// not have a v2 hash and we shouldn't get here
			sha256_hash const info_hash = hasher256(metadata_buf).final();
			if (info_hash != m_torrent_file->info_hashes().v2)
			{
				if (alerts().should_post<metadata_failed_alert>())
				{
					alerts().emplace_alert<metadata_failed_alert>(get_handle()
						, errors::mismatching_info_hash);
				}
				return false;
			}
		}

		// the torrent's info hash might change
		// e.g. it could be a hybrid torrent which we only had one of the hashes for
		// so remove the existing entry
		info_hash_t const old_ih = m_torrent_file->info_hashes();

		error_code ec;
		int pos = 0;
		bdecode_node const metadata = bdecode(metadata_buf, ec, &pos, 200
			, settings().get_int(settings_pack::metadata_token_limit));

		auto info = std::make_shared<torrent_info>(*m_torrent_file);
		if (ec || !info->parse_info_section(metadata, ec
			, settings().get_int(settings_pack::max_piece_count)))
		{
			update_gauge();
			// this means the metadata is correct, since we
			// verified it against the info-hash, but we
			// failed to parse it. Pause the torrent
			if (alerts().should_post<metadata_failed_alert>())
			{
				alerts().emplace_alert<metadata_failed_alert>(get_handle(), ec);
			}
			set_error(errors::invalid_swarm_metadata, torrent_status::error_file_none);
			pause();
			return false;
		}

		// we might already have this torrent in the session.
		bool failed = false;
		info->info_hashes().for_each([&](sha1_hash const& ih, protocol_version)
		{
			if (failed) return;

			auto t = m_ses.find_torrent(info_hash_t(ih)).lock();
			if (t && t != shared_from_this())
			{
				TORRENT_ASSERT(!t->valid_metadata());

				// if we get a collision, both torrents fail and have to be
				// removed. This is because updating the info_hash_t for this
				// torrent would conflict with torrent "t". That would violate
				// the invariants:
				//   1. an info-hash can only refer to a single torrent
				//   2. every torrent needs at least one info-hash.
				t->set_error(errors::duplicate_torrent, torrent_status::error_file_metadata);
				t->pause();

				set_error(errors::duplicate_torrent, torrent_status::error_file_metadata);
				pause();
				failed = true;

				if (alerts().should_post<torrent_conflict_alert>())
				{
					alerts().emplace_alert<torrent_conflict_alert>(get_handle()
						, torrent_handle(std::move(t)), std::move(info));
				}
			}
		});

		if (failed) return true;
		if (m_abort) return true;

		m_torrent_file = info;
		m_info_hash = m_torrent_file->info_hashes();

		m_size_on_disk = m_torrent_file->files().size_on_disk();

		m_ses.update_torrent_info_hash(shared_from_this(), old_ih);

		ec = initialize_merkle_trees();
		if (ec)
		{
			set_error(ec, torrent_status::error_file_metadata);
			pause();
			return false;
		}

		update_gauge();
		update_want_tick();

		if (m_ses.alerts().should_post<metadata_received_alert>())
		{
			m_ses.alerts().emplace_alert<metadata_received_alert>(
				get_handle());
		}

		// we have to initialize the torrent before we start
		// disconnecting redundant peers, otherwise we'll think
		// we're a seed, because we have all 0 pieces
		init();

		inc_stats_counter(counters::num_total_pieces_added
			, m_torrent_file->num_pieces());

		// disconnect redundant peers
		for (auto* p : m_connections)
			p->disconnect_if_redundant();

		set_need_save_resume(torrent_handle::if_metadata_changed);

		return true;
	}